

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

char * duckdb::StringUtil::EnumToString
                 (EnumStringLiteral *enum_list,idx_t enum_count,char *enum_name,uint32_t enum_value)

{
  EnumStringLiteral *pEVar1;
  char *in_RAX;
  NotImplementedException *this;
  EnumStringLiteral *pEVar2;
  bool bVar3;
  string local_48;
  
  bVar3 = enum_count != 0;
  if (bVar3) {
    if (enum_list->number != enum_value) {
      in_RAX = (char *)0x0;
      pEVar2 = enum_list;
      do {
        if ((char *)(enum_count - 1) == in_RAX) {
          bVar3 = false;
          goto LAB_00e8362c;
        }
        enum_list = pEVar2 + 1;
        in_RAX = in_RAX + 1;
        pEVar1 = pEVar2 + 1;
        pEVar2 = enum_list;
      } while (pEVar1->number != enum_value);
      bVar3 = in_RAX < enum_count;
    }
    in_RAX = enum_list->string;
  }
LAB_00e8362c:
  if (!bVar3) {
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Enum value: unrecognized enum value \"%d\" for enum \"%s\"","");
    NotImplementedException::NotImplementedException<unsigned_int,char_const*>
              (this,&local_48,enum_value,enum_name);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return in_RAX;
}

Assistant:

const char *StringUtil::EnumToString(const EnumStringLiteral enum_list[], idx_t enum_count, const char *enum_name,
                                     uint32_t enum_value) {
	for (idx_t i = 0; i < enum_count; i++) {
		if (enum_list[i].number == enum_value) {
			return enum_list[i].string;
		}
	}
	throw NotImplementedException("Enum value: unrecognized enum value \"%d\" for enum \"%s\"", enum_value, enum_name);
}